

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O3

ZeroCopyInputStream * __thiscall
google::protobuf::compiler::DiskSourceTree::OpenVirtualFile
          (DiskSourceTree *this,string_view virtual_file,string *disk_file)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  ZeroCopyInputStream *pZVar4;
  int *piVar5;
  char *pcVar6;
  char *pcVar7;
  compiler *this_00;
  size_type __rlen;
  pointer pcVar8;
  pointer pMVar9;
  bool bVar10;
  string_view filename;
  string_view path;
  string_view old_prefix;
  string_view new_prefix;
  string temp_disk_file;
  string local_f0;
  ZeroCopyInputStream *local_d0;
  string *local_c8;
  string *local_c0;
  pointer local_b8;
  undefined1 local_b0 [48];
  undefined1 local_80 [32];
  basic_string_view<char,_std::char_traits<char>_> local_60 [3];
  
  path._M_len = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)virtual_file._M_str;
  this_00 = (compiler *)virtual_file._M_len;
  path._M_str = (char *)disk_file;
  CanonicalizePath_abi_cxx11_((string *)local_b0,this_00,path);
  pcVar8 = (pointer)local_b0._0_8_;
  if ((compiler *)local_b0._8_8_ == this_00) {
    if (this_00 == (compiler *)0x0) goto LAB_001cd1fb;
    iVar2 = bcmp(path._M_len,(void *)local_b0._0_8_,(size_t)this_00);
    if (iVar2 != 0) goto LAB_001cd191;
    if (this_00 == (compiler *)0x2) {
      if (*(short *)path._M_len == 0x2e2e) {
        bVar10 = true;
      }
      else {
LAB_001cd1fb:
        local_60[0]._M_len = (size_t)this_00;
        local_60[0]._M_str = (char *)path._M_len;
        sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find(local_60,"/../",0,4);
        bVar10 = sVar3 != 0xffffffffffffffff;
        pcVar8 = (pointer)local_b0._0_8_;
      }
    }
    else if ((this_00 < (compiler *)0x3) ||
            ((bVar10 = true,
             *(char *)((long)path._M_len + 2) != '/' || *(short *)path._M_len != 0x2e2e &&
             (this_00[(long)((long)path._M_len + -1)] != (compiler)0x2e ||
              *(short *)(this_00 + (long)((long)path._M_len + -3)) != 0x2e2f)))) goto LAB_001cd1fb;
    if (pcVar8 != local_b0 + 0x10) {
      operator_delete(pcVar8,local_b0._16_8_ + 1);
    }
    if (!bVar10) {
      pMVar9 = (this->mappings_).
               super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_b8 = (this->mappings_).
                 super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      local_c0 = disk_file;
      if (pMVar9 != local_b8) {
        local_c8 = (string *)&this->last_error_message_;
        do {
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          local_f0._M_string_length = 0;
          local_f0.field_2._M_local_buf[0] = '\0';
          old_prefix._M_str = (pMVar9->virtual_path)._M_dataplus._M_p;
          old_prefix._M_len = (pMVar9->virtual_path)._M_string_length;
          new_prefix._M_str = (pMVar9->disk_path)._M_dataplus._M_p;
          new_prefix._M_len = (pMVar9->disk_path)._M_string_length;
          bVar1 = ApplyMapping(virtual_file,old_prefix,new_prefix,&local_f0);
          bVar10 = true;
          if (bVar1) {
            filename._M_str = local_f0._M_dataplus._M_p;
            filename._M_len = local_f0._M_string_length;
            pZVar4 = OpenDiskFile(this,filename);
            if (pZVar4 == (ZeroCopyInputStream *)0x0) {
              piVar5 = __errno_location();
              if (*piVar5 == 0xd) {
                local_b0._0_8_ = (pointer)0x20;
                local_b0._8_8_ = "Read access is denied for file: ";
                local_60[0]._M_len = local_f0._M_string_length;
                local_60[0]._M_str = local_f0._M_dataplus._M_p;
                absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_80,(AlphaNum *)local_b0);
                std::__cxx11::string::operator=(local_c8,(string *)local_80);
                if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
                  operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
                }
                bVar10 = false;
                local_d0 = (ZeroCopyInputStream *)0x0;
              }
            }
            else {
              if (local_c0 != (string *)0x0) {
                std::__cxx11::string::_M_assign((string *)local_c0);
              }
              bVar10 = false;
              local_d0 = pZVar4;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,
                            CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                                     local_f0.field_2._M_local_buf[0]) + 1);
          }
          if (!bVar10) {
            return local_d0;
          }
          pMVar9 = pMVar9 + 1;
        } while (pMVar9 != local_b8);
      }
      pcVar7 = (char *)(this->last_error_message_)._M_string_length;
      pcVar6 = "File not found.";
      goto LAB_001cd261;
    }
  }
  else {
LAB_001cd191:
    if (pcVar8 != local_b0 + 0x10) {
      operator_delete(pcVar8,local_b0._16_8_ + 1);
    }
  }
  pcVar7 = (char *)(this->last_error_message_)._M_string_length;
  pcVar6 = "Backslashes, consecutive slashes, \".\", or \"..\" are not allowed in the virtual path";
LAB_001cd261:
  std::__cxx11::string::_M_replace((ulong)&this->last_error_message_,0,pcVar7,(ulong)pcVar6);
  return (ZeroCopyInputStream *)0x0;
}

Assistant:

io::ZeroCopyInputStream* DiskSourceTree::OpenVirtualFile(
    absl::string_view virtual_file, std::string* disk_file) {
  if (virtual_file != CanonicalizePath(virtual_file) ||
      ContainsParentReference(virtual_file)) {
    // We do not allow importing of paths containing things like ".." or
    // consecutive slashes since the compiler expects files to be uniquely
    // identified by file name.
    last_error_message_ =
        "Backslashes, consecutive slashes, \".\", or \"..\" "
        "are not allowed in the virtual path";
    return nullptr;
  }

  for (const auto& mapping : mappings_) {
    std::string temp_disk_file;
    if (ApplyMapping(virtual_file, mapping.virtual_path, mapping.disk_path,
                     &temp_disk_file)) {
      io::ZeroCopyInputStream* stream = OpenDiskFile(temp_disk_file);
      if (stream != nullptr) {
        if (disk_file != nullptr) {
          *disk_file = temp_disk_file;
        }
        return stream;
      }

      if (errno == EACCES) {
        // The file exists but is not readable.
        last_error_message_ =
            absl::StrCat("Read access is denied for file: ", temp_disk_file);
        return nullptr;
      }
    }
  }
  last_error_message_ = "File not found.";
  return nullptr;
}